

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimgrb.cpp
# Opt level: O2

void __thiscall
CVmObjTable::rebuild_image
          (CVmObjTable *this,int meta_dep_idx,CVmImageWriter *writer,CVmConstMapper *mapper)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = 2;
  while( true ) {
    bVar2 = iVar1 == 0;
    iVar1 = iVar1 + -1;
    if (bVar2) break;
    rebuild_image(this,meta_dep_idx,writer,mapper,(uint)(iVar1 == 0));
  }
  return;
}

Assistant:

void CVmObjTable::rebuild_image(VMG_ int meta_dep_idx, CVmImageWriter *writer,
                                class CVmConstMapper *mapper)
{
    int pass;
    
    /* write persistent and transient objects separately */
    for (pass = 1 ; pass <= 2 ; ++pass)
    {
        int trans;

        /* write persistent on pass 1, transient on pass 2 */
        trans = (pass == 2);

        /* write the objects for this pass */
        rebuild_image(vmg_ meta_dep_idx, writer, mapper, trans);
    }
}